

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.cpp
# Opt level: O0

uint32_t event_track::get_meta_segment_bytes
                   (vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
                    *in_emsg_list,uint64_t seg_start,uint64_t seg_end,uint32_t track_id,
                   uint32_t timescale,
                   vector<unsigned_char,_std::allocator<unsigned_char>_> *segment_bytes,
                   uint32_t seq_num,bool is_vtt)

{
  _Ios_Openmode _Var1;
  size_type sVar2;
  undefined1 auVar3 [16];
  value_type_conflict3 local_219;
  undefined1 local_218 [16];
  value_type_conflict3 local_201;
  fpos afStack_200 [7];
  char c;
  undefined8 local_1f8;
  size_type local_1f0;
  uint64_t length;
  undefined1 local_1d8 [8];
  vector<event_track::EventSample,_std::allocator<event_track::EventSample>_> samples_in_segment;
  stringstream ot;
  ostream local_1b0 [383];
  byte local_31;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvStack_30;
  bool is_vtt_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *segment_bytes_local;
  uint32_t timescale_local;
  uint32_t track_id_local;
  uint64_t seg_end_local;
  uint64_t seg_start_local;
  vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
  *in_emsg_list_local;
  
  local_31 = is_vtt;
  pvStack_30 = segment_bytes;
  segment_bytes_local._0_4_ = timescale;
  segment_bytes_local._4_4_ = track_id;
  _timescale_local = seg_end;
  seg_end_local = seg_start;
  seg_start_local = (uint64_t)in_emsg_list;
  _Var1 = std::operator|(_S_out,_S_in);
  _Var1 = std::operator|(_Var1,_S_bin);
  std::__cxx11::stringstream::stringstream
            ((stringstream *)
             &samples_in_segment.
              super__Vector_base<event_track::EventSample,_std::allocator<event_track::EventSample>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,_Var1);
  Catch::clara::std::vector<event_track::EventSample,_std::allocator<event_track::EventSample>_>::
  vector((vector<event_track::EventSample,_std::allocator<event_track::EventSample>_> *)local_1d8);
  find_event_samples((vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
                      *)seg_start_local,
                     (vector<event_track::EventSample,_std::allocator<event_track::EventSample>_> *)
                     local_1d8,seg_end_local,_timescale_local,(bool)(local_31 & 1));
  write_evt_samples_as_fmp4_fragment
            ((vector<event_track::EventSample,_std::allocator<event_track::EventSample>_> *)
             local_1d8,local_1b0,seg_end_local,segment_bytes_local._4_4_,_timescale_local,seq_num);
  std::istream::seekg((long)&samples_in_segment.
                             super__Vector_base<event_track::EventSample,_std::allocator<event_track::EventSample>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,_S_beg);
  _afStack_200 = std::istream::tellg();
  local_1f0 = std::fpos::operator_cast_to_long(afStack_200);
  std::istream::seekg((long)&samples_in_segment.
                             super__Vector_base<event_track::EventSample,_std::allocator<event_track::EventSample>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,_S_beg);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(pvStack_30);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(pvStack_30,local_1f0);
  while( true ) {
    auVar3 = std::istream::tellg();
    local_218 = auVar3;
    sVar2 = std::fpos::operator_cast_to_long((fpos *)local_218);
    if (sVar2 == local_1f0) break;
    local_219 = std::istream::get();
    local_201 = local_219;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(pvStack_30,&local_219);
  }
  sVar2 = Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvStack_30);
  Catch::clara::std::vector<event_track::EventSample,_std::allocator<event_track::EventSample>_>::
  ~vector((vector<event_track::EventSample,_std::allocator<event_track::EventSample>_> *)local_1d8);
  std::__cxx11::stringstream::~stringstream
            ((stringstream *)
             &samples_in_segment.
              super__Vector_base<event_track::EventSample,_std::allocator<event_track::EventSample>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return (uint32_t)sVar2;
}

Assistant:

uint32_t event_track::get_meta_segment_bytes(
	std::vector<event_track::DASHEventMessageBoxv1>& in_emsg_list,
	uint64_t seg_start,
	uint64_t seg_end,
	uint32_t track_id,
	uint32_t timescale,
	std::vector<uint8_t>& segment_bytes,
	uint32_t seq_num,
    bool is_vtt)
{
	std::stringstream ot(
		std::stringstream::out | \
		std::stringstream::in | \
		std::stringstream::binary\
	);

	std::vector<event_track::EventSample> samples_in_segment;

	find_event_samples(
		in_emsg_list,
		samples_in_segment,
		seg_start,
		seg_end,
		is_vtt
	);

	event_track::write_evt_samples_as_fmp4_fragment(
		samples_in_segment,
		ot,
		seg_start,
		track_id,
		seg_end,
		seq_num
	);

	ot.seekg(0, ot.end);
	uint64_t length = ot.tellg();
	ot.seekg(0, ot.beg);
	segment_bytes.clear();
	segment_bytes.reserve(length);

	char c;
	while (ot.tellg() != length)
	{
		c = ot.get();
		segment_bytes.push_back((uint8_t)c);
	}

	return (uint32_t)segment_bytes.size();
}